

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

bool __thiscall FOptionMenuScreenResolutionLine::Activate(FOptionMenuScreenResolutionLine *this)

{
  FSoundID local_4;
  
  S_FindSound("menu/choose");
  S_Sound(0x22,&local_4,snd_menuvolume.Value,0.0);
  M_SetVideoMode();
  return true;
}

Assistant:

bool Activate()
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		M_SetVideoMode();
		return true;
	}